

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
          (Interpreter *this,LocationRange *loc)

{
  Interpreter *this_00;
  string *msg;
  LocationRange *in_RDX;
  long in_RSI;
  UString *in_RDI;
  stringstream ss;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffe18;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffe20;
  string local_1d0 [12];
  Type in_stack_fffffffffffffe3c;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  LocationRange *local_18;
  
  if (*(int *)(in_RSI + 0x40) != 0x13) {
    local_18 = in_RDX;
    std::__cxx11::stringstream::stringstream(local_1a0);
    this_00 = (Interpreter *)std::operator<<(local_190,"expected string result, got: ");
    type_str_abi_cxx11_(in_stack_fffffffffffffe3c);
    std::operator<<((ostream *)this_00,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    msg = (string *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    anon_unknown_0::Interpreter::makeError(this_00,local_18,msg);
    __cxa_throw(msg,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::__cxx11::u32string::u32string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  return in_RDI;
}

Assistant:

UString manifestString(const LocationRange &loc)
    {
        if (scratch.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string result, got: " << type_str(scratch.t);
            throw makeError(loc, ss.str());
        }
        return static_cast<HeapString *>(scratch.v.h)->value;
    }